

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathEvaluatePredicateResult(xmlXPathParserContextPtr ctxt,xmlXPathObjectPtr res)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  bool local_31;
  xmlLocationSetPtr ptr;
  xmlXPathObjectPtr res_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (res == (xmlXPathObjectPtr)0x0)) {
    ctxt_local._4_4_ = 0;
  }
  else {
    switch(res->type) {
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      if (res->nodesetval == (xmlNodeSetPtr)0x0) {
        ctxt_local._4_4_ = 0;
      }
      else {
        ctxt_local._4_4_ = (uint)(res->nodesetval->nodeNr != 0);
      }
      break;
    case XPATH_BOOLEAN:
      ctxt_local._4_4_ = res->boolval;
      break;
    case XPATH_NUMBER:
      ctxt_local._4_4_ = (uint)(res->floatval == (double)ctxt->context->proximityPosition);
      break;
    case XPATH_STRING:
      local_31 = false;
      if (res->stringval != (xmlChar *)0x0) {
        local_31 = *res->stringval != '\0';
      }
      ctxt_local._4_4_ = (uint)local_31;
      break;
    default:
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Internal error at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                ,0x36e6);
      ctxt_local._4_4_ = 0;
      break;
    case XPATH_LOCATIONSET:
      if ((int *)res->user == (int *)0x0) {
        ctxt_local._4_4_ = 0;
      }
      else {
        ctxt_local._4_4_ = (uint)(*res->user != 0);
      }
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlXPathEvaluatePredicateResult(xmlXPathParserContextPtr ctxt,
                                xmlXPathObjectPtr res) {
    if ((ctxt == NULL) || (res == NULL)) return(0);
    switch (res->type) {
        case XPATH_BOOLEAN:
	    return(res->boolval);
        case XPATH_NUMBER:
#if defined(__BORLANDC__) || (defined(_MSC_VER) && (_MSC_VER == 1200))
	    return((res->floatval == ctxt->context->proximityPosition) &&
	           (!xmlXPathIsNaN(res->floatval))); /* MSC pbm Mark Vakoc !*/
#else
	    return(res->floatval == ctxt->context->proximityPosition);
#endif
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
	    if (res->nodesetval == NULL)
		return(0);
	    return(res->nodesetval->nodeNr != 0);
        case XPATH_STRING:
	    return((res->stringval != NULL) && (res->stringval[0] != 0));
#ifdef LIBXML_XPTR_ENABLED
	case XPATH_LOCATIONSET:{
	    xmlLocationSetPtr ptr = res->user;
	    if (ptr == NULL)
	        return(0);
	    return (ptr->locNr != 0);
	    }
#endif
        default:
	    STRANGE
    }
    return(0);
}